

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap.hpp
# Opt level: O3

void chaiscript::bootstrap::construct_pod<unsigned_long_long>(string *type,Module *m)

{
  pointer pcVar1;
  undefined1 local_49;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  dispatch::detail::
  make_callable_impl<chaiscript::bootstrap::construct_pod<unsigned_long_long>(std::__cxx11::string_const&,chaiscript::Module&)::_lambda(chaiscript::Boxed_Number_const&)_1_,false,false,false,true,unsigned_long_long,chaiscript::Boxed_Number_const&>
            (&local_48,&local_49);
  pcVar1 = (type->_M_dataplus)._M_p;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,pcVar1,pcVar1 + type->_M_string_length);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)&m->m_funcs,&local_48,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  if (local_48.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

void construct_pod(const std::string &type, Module &m) {
    m.add(fun([](const Boxed_Number &bn) { return bn.get_as<T>(); }), type);
  }